

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void get_first_length(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
                     cio_read_buffer *buffer,size_t num_bytes)

{
  _Bool _Var1;
  byte bVar2;
  byte *pbVar3;
  _Bool is_server;
  _Bool frame_is_masked;
  uint8_t field;
  uint8_t *ptr;
  cio_websocket *websocket;
  size_t num_bytes_local;
  cio_read_buffer *buffer_local;
  cio_error err_local;
  void *handler_context_local;
  cio_buffered_stream *buffered_stream_local;
  
  _Var1 = handled_read_error((cio_websocket *)handler_context,err);
  if (!_Var1) {
    pbVar3 = cio_read_buffer_get_read_ptr(buffer);
    bVar2 = *pbVar3;
    cio_read_buffer_consume(buffer,num_bytes);
    if (((bVar2 & 0x80) == 0x80) == ((*(ushort *)((long)handler_context + 0x10) >> 10 & 1) == 1)) {
      bVar2 = bVar2 & 0x7f;
      if (bVar2 < 0x7e) {
        *(ulong *)((long)handler_context + 8) = (ulong)bVar2;
        *(ulong *)handler_context = (ulong)bVar2;
        get_mask_or_payload((cio_websocket *)handler_context,buffered_stream,buffer);
        buffer_local._4_4_ = err;
      }
      else {
        _Var1 = is_control_frame((uint)(*(ushort *)((long)handler_context + 0x10) >> 1 & 0xf));
        if (_Var1) {
          handle_error((cio_websocket *)handler_context,CIO_PROTOCOL_NOT_SUPPORTED,
                       CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR,"payload of control frame too long");
          return;
        }
        if (bVar2 == 0x7e) {
          buffer_local._4_4_ =
               cio_buffered_stream_read_at_least
                         (buffered_stream,buffer,2,get_length16,handler_context);
        }
        else {
          buffer_local._4_4_ =
               cio_buffered_stream_read_at_least
                         (buffered_stream,buffer,8,get_length64,handler_context);
        }
      }
      if (buffer_local._4_4_ != CIO_SUCCESS) {
        handle_error((cio_websocket *)handler_context,buffer_local._4_4_,
                     CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,
                     "error while start reading extended websocket frame length");
      }
    }
    else {
      handle_error((cio_websocket *)handler_context,CIO_PROTOCOL_NOT_SUPPORTED,
                   CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR,"received unmasked frame on server websocket")
      ;
    }
  }
  return;
}

Assistant:

static void get_first_length(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	if (cio_unlikely(handled_read_error(websocket, err))) {
		return;
	}

	uint8_t *ptr = cio_read_buffer_get_read_ptr(buffer);
	uint8_t field = *ptr;
	cio_read_buffer_consume(buffer, num_bytes);

	bool frame_is_masked = (field & WS_MASK_SET) == WS_MASK_SET;
	bool is_server = websocket->ws_private.ws_flags.is_server == 1U;
	if (frame_is_masked != is_server) {
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, "received unmasked frame on server websocket");
		return;
	}

	field = field & (uint8_t)(~WS_MASK_SET);
	if (field <= CIO_WEBSOCKET_SMALL_FRAME_SIZE) {
		websocket->ws_private.remaining_read_frame_length = (size_t)field;
		websocket->ws_private.read_frame_length = (size_t)field;
		get_mask_or_payload(websocket, buffered_stream, buffer);
	} else {
		if (cio_unlikely(is_control_frame(websocket->ws_private.ws_flags.opcode))) {
			handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, "payload of control frame too long");
			return;
		}

		if (field == CIO_WEBSOCKET_SMALL_FRAME_SIZE + 1) {
			err = cio_buffered_stream_read_at_least(buffered_stream, buffer, sizeof(uint16_t), get_length16, websocket);
		} else {
			err = cio_buffered_stream_read_at_least(buffered_stream, buffer, sizeof(uint64_t), get_length64, websocket);
		}
	}

	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "error while start reading extended websocket frame length");
	}
}